

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

long __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,long a_nDefault,bool *a_pHasMultiple)

{
  int __base;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  SI_ConvertA<char> c;
  char *pszSuffix;
  char szValue [64];
  
  pcVar2 = GetValue(this,a_pSection,a_pKey,(char *)0x0,a_pHasMultiple);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    szValue[0x30] = '\0';
    szValue[0x31] = '\0';
    szValue[0x32] = '\0';
    szValue[0x33] = '\0';
    szValue[0x34] = '\0';
    szValue[0x35] = '\0';
    szValue[0x36] = '\0';
    szValue[0x37] = '\0';
    szValue[0x38] = '\0';
    szValue[0x39] = '\0';
    szValue[0x3a] = '\0';
    szValue[0x3b] = '\0';
    szValue[0x3c] = '\0';
    szValue[0x3d] = '\0';
    szValue[0x3e] = '\0';
    szValue[0x3f] = '\0';
    szValue[0x20] = '\0';
    szValue[0x21] = '\0';
    szValue[0x22] = '\0';
    szValue[0x23] = '\0';
    szValue[0x24] = '\0';
    szValue[0x25] = '\0';
    szValue[0x26] = '\0';
    szValue[0x27] = '\0';
    szValue[0x28] = '\0';
    szValue[0x29] = '\0';
    szValue[0x2a] = '\0';
    szValue[0x2b] = '\0';
    szValue[0x2c] = '\0';
    szValue[0x2d] = '\0';
    szValue[0x2e] = '\0';
    szValue[0x2f] = '\0';
    szValue[0x10] = '\0';
    szValue[0x11] = '\0';
    szValue[0x12] = '\0';
    szValue[0x13] = '\0';
    szValue[0x14] = '\0';
    szValue[0x15] = '\0';
    szValue[0x16] = '\0';
    szValue[0x17] = '\0';
    szValue[0x18] = '\0';
    szValue[0x19] = '\0';
    szValue[0x1a] = '\0';
    szValue[0x1b] = '\0';
    szValue[0x1c] = '\0';
    szValue[0x1d] = '\0';
    szValue[0x1e] = '\0';
    szValue[0x1f] = '\0';
    szValue[0] = '\0';
    szValue[1] = '\0';
    szValue[2] = '\0';
    szValue[3] = '\0';
    szValue[4] = '\0';
    szValue[5] = '\0';
    szValue[6] = '\0';
    szValue[7] = '\0';
    szValue[8] = '\0';
    szValue[9] = '\0';
    szValue[10] = '\0';
    szValue[0xb] = '\0';
    szValue[0xc] = '\0';
    szValue[0xd] = '\0';
    szValue[0xe] = '\0';
    szValue[0xf] = '\0';
    c.m_bStoreIsUtf8 = this->m_bStoreIsUtf8;
    bVar1 = SI_ConvertA<char>::ConvertToStore(&c,pcVar2,szValue,0x40);
    if (bVar1) {
      if ((szValue[0] == '0') && ((szValue[1] & 0xdfU) == 0x58)) {
        if (szValue[2] == '\0') {
          return a_nDefault;
        }
        pcVar2 = szValue + 2;
        __base = 0x10;
      }
      else {
        pcVar2 = szValue;
        __base = 10;
      }
      pszSuffix = szValue;
      lVar3 = strtol(pcVar2,&pszSuffix,__base);
      if (*pszSuffix == '\0') {
        a_nDefault = lVar3;
      }
    }
  }
  return a_nDefault;
}

Assistant:

long
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::GetLongValue(
    const SI_CHAR * a_pSection,
    const SI_CHAR * a_pKey,
    long            a_nDefault,
    bool *          a_pHasMultiple
    ) const
{
    // return the default if we don't have a value
    const SI_CHAR * pszValue = GetValue(a_pSection, a_pKey, NULL, a_pHasMultiple);
    if (!pszValue || !*pszValue) return a_nDefault;

    // convert to UTF-8/MBCS which for a numeric value will be the same as ASCII
    char szValue[64] = { 0 };
    SI_CONVERTER c(m_bStoreIsUtf8);
    if (!c.ConvertToStore(pszValue, szValue, sizeof(szValue))) {
        return a_nDefault;
    }

    // handle the value as hex if prefaced with "0x"
    long nValue = a_nDefault;
    char * pszSuffix = szValue;
    if (szValue[0] == '0' && (szValue[1] == 'x' || szValue[1] == 'X')) {
    	if (!szValue[2]) return a_nDefault;
        nValue = strtol(&szValue[2], &pszSuffix, 16);
    }
    else {
        nValue = strtol(szValue, &pszSuffix, 10);
    }

    // any invalid strings will return the default value
    if (*pszSuffix) {
        return a_nDefault;
    }

    return nValue;
}